

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinatorProcessing.cpp
# Opt level: O1

tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> __thiscall
helics::processCoordinatorMessage
          (helics *this,ActionMessage *cmd,TimeCoordinator *timeCoord,FederateStates state,
          bool timeGranted_mode,GlobalFederateId localID)

{
  ushort uVar1;
  bool bVar2;
  helics hVar3;
  int iVar4;
  uint uVar5;
  action_t aVar6;
  GlobalFederateId triggerFed;
  ulong uVar7;
  FederateStates FVar8;
  helics hVar9;
  helics hVar10;
  pthread_t local_38;
  
  aVar6 = cmd->messageAction;
  hVar10 = (helics)0xfe;
  hVar9 = (helics)timeGranted_mode;
  hVar3 = hVar10;
  if ((cmd_remove_publication|cmd_disconnect) < aVar6) {
    if (aVar6 < cmd_time_request) {
      if (((uint)(aVar6 + ~(cmd_remove_publication|cmd_disconnect)) < 10) &&
         ((0x333U >> (aVar6 + ~(cmd_remove_publication|cmd_disconnect) & 0x1fU) & 1) != 0)) {
        if ((cmd->dest_id).gid == localID.gid) {
          BaseTimeCoordinator::processDependencyUpdateMessage
                    (&timeCoord->super_BaseTimeCoordinator,cmd);
        }
        goto switchD_0032bf3b_caseD_4;
      }
      if (aVar6 != cmd_timing_info) goto switchD_0032bf3b_caseD_4;
      goto switchD_0032bf3b_caseD_26;
    }
    if (aVar6 < cmd_disconnect_fed_ack) {
      if (aVar6 != cmd_time_request) {
        if (aVar6 == cmd_force_time_grant) {
          if ((timeCoord->time_granted).internalTimeCode <= (cmd->actionTime).internalTimeCode) {
            (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(timeCoord,cmd);
            hVar9 = (helics)0x1;
            hVar3 = (helics)0x0;
          }
        }
        else if (aVar6 == cmd_user_return) {
          local_38 = pthread_self();
          iVar4 = std::_Hash_bytes(&local_38,8,0xc70f6907);
          hVar3 = (helics)0xfe;
          if (cmd->messageID == iVar4) {
            hVar3 = (helics)0x5;
          }
        }
        goto switchD_0032bf3b_caseD_4;
      }
      goto switchD_0032bf3b_caseD_23;
    }
    if ((5 < (uint)(aVar6 + 0xffffd8f0)) || ((0x29U >> (aVar6 + 0xffffd8f0 & 0x1fU) & 1) == 0)) {
      if ((aVar6 == cmd_disconnect_fed_ack) &&
         (((cmd->dest_id).gid == localID.gid && ((cmd->source_id).gid == 0)))) {
        if ((state != TERMINATING) && (state != FINISHED)) {
          BaseTimeCoordinator::disconnect(&timeCoord->super_BaseTimeCoordinator);
        }
        state = FINISHED;
        hVar3 = (helics)0x3;
      }
      goto switchD_0032bf3b_caseD_4;
    }
    if ((((aVar6 == cmd_global_error) || (uVar5 = (cmd->source_id).gid, uVar5 == localID.gid)) ||
        (uVar5 < 2)) || ((cmd->dest_id).gid != localID.gid)) {
      if ((state != TERMINATING) && (state != FINISHED)) {
        state = ERRORED;
        hVar3 = (helics)0x7;
        if (aVar6 != cmd_global_error) {
          TimeCoordinator::localError(timeCoord);
        }
      }
      goto switchD_0032bf3b_caseD_4;
    }
switchD_0032bf3b_caseD_7:
    uVar5 = (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(timeCoord,cmd);
    hVar3 = (helics)0xfe;
    if ((char)uVar5 == '\0') {
      bVar2 = true;
    }
    else if ((uVar5 & 0xff) == 5) {
      bVar2 = true;
      hVar3 = (helics)0xff;
    }
    else {
      bVar2 = false;
    }
    if ((bVar2 || timeGranted_mode) || state != EXECUTING) goto switchD_0032bf3b_caseD_4;
LAB_0032c1fd:
    triggerFed.gid = -2010000000;
LAB_0032c205:
    hVar3 = (helics)TimeCoordinator::checkTimeGrant(timeCoord,triggerFed);
    hVar9 = (helics)0x1;
    if ((char)hVar3 < NEXT_STEP) {
      hVar9 = (helics)timeGranted_mode;
    }
    goto switchD_0032bf3b_caseD_4;
  }
  switch(aVar6) {
  case cmd_disconnect:
  case cmd_disconnect_fed:
    if ((cmd->source_id).gid == localID.gid) {
      if ((state == TERMINATING) || (state == FINISHED)) break;
      BaseTimeCoordinator::disconnect(&timeCoord->super_BaseTimeCoordinator);
      (cmd->dest_id).gid = 0;
      state = TERMINATING;
      goto LAB_0032c0da;
    }
    iVar4 = (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(timeCoord,cmd);
    if (state != EXECUTING || timeGranted_mode) {
      hVar3 = (helics)((char)iVar4 == '\x05' | CONTINUE_PROCESSING);
      break;
    }
    goto LAB_0032c1fd;
  case cmd_broadcast_disconnect:
  case cmd_disconnect_core:
  case cmd_disconnect_broker:
    goto switchD_0032bf3b_caseD_7;
  case cmd_init_grant:
    if (state == CREATED) {
      uVar1 = cmd->flags;
      if ((uVar1 & 0x300) != 0) {
        timeCoord->dynamicJoining = true;
      }
      FVar8 = (FederateStates)uVar1 & INITIALIZING;
      state = FVar8 ^ INITIALIZING;
      hVar9 = (helics)state;
      hVar3 = (helics)(FVar8 * '\x02');
    }
    break;
  case cmd_exec_request:
    if (((cmd->source_id).gid == localID.gid) && (uVar1 = cmd->flags, (uVar1 & 0x20) != 0)) {
      uVar5 = (uint)(byte)(((uVar1 & 4) == 0) + 1);
      if ((uVar1 & 1) == 0) {
        uVar5 = uVar1 & 1;
      }
      (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[10])
                (timeCoord,(ulong)uVar5);
      hVar9 = (helics)0x0;
      break;
    }
  case cmd_exec_grant:
    uVar5 = (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(timeCoord,cmd);
    if ((char)uVar5 == '\x05') {
LAB_0032c2a7:
      hVar3 = (helics)0xff;
    }
    else if ((uVar5 & 0xff) != 0) {
switchD_0032bf3b_caseD_18:
      if (state == INITIALIZING && !timeGranted_mode) {
        uVar7 = 0x8831d580;
        if (cmd->messageAction == cmd_exec_request) {
          uVar7 = (ulong)(uint)(cmd->source_id).gid;
        }
        uVar5 = (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[9])
                          (timeCoord,uVar7);
        hVar3 = SUB41(uVar5,0);
        if (hVar3 == (helics)0xfe) {
          hVar3 = hVar10;
          if ((cmd->messageAction == cmd_exec_grant) && ((cmd->flags & 1) == 0)) {
            TimeCoordinator::sendUpdatedExecRequest
                      (timeCoord,(GlobalFederateId)0x8831d580,(GlobalFederateId)0x8831d580,0);
          }
        }
        else {
          hVar9 = (helics)0x1;
          if ((uVar5 & 0xff) == 0) {
            state = EXECUTING;
          }
        }
      }
    }
    break;
  case cmd_exec_check:
    goto switchD_0032bf3b_caseD_18;
  case cmd_stop:
    BaseTimeCoordinator::disconnect(&timeCoord->super_BaseTimeCoordinator);
  case cmd_terminate_immediately:
    state = FINISHED;
    hVar3 = (helics)0x3;
    break;
  case cmd_time_grant:
switchD_0032bf3b_caseD_23:
    uVar5 = (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(timeCoord,cmd);
    if ((char)uVar5 != '\x05') {
      if ((uVar5 & 0xff) == 0) break;
      goto switchD_0032bf3b_caseD_24;
    }
    goto LAB_0032c2a7;
  case cmd_time_check:
switchD_0032bf3b_caseD_24:
    if (state != EXECUTING) {
LAB_0032c0c0:
      if (state != INITIALIZING) break;
      aVar6 = cmd_exec_check;
      goto LAB_0032c0d5;
    }
    if (timeGranted_mode) break;
    triggerFed.gid = -2010000000;
    if (cmd->messageAction == cmd_time_request) {
      triggerFed.gid = (cmd->source_id).gid;
    }
    goto LAB_0032c205;
  case cmd_request_current_time:
switchD_0032bf3b_caseD_26:
    (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(timeCoord,cmd);
    break;
  case cmd_time_block:
  case cmd_time_unblock:
  case cmd_time_barrier:
  case cmd_time_barrier_clear:
    iVar4 = (*(timeCoord->super_BaseTimeCoordinator)._vptr_BaseTimeCoordinator[3])(timeCoord,cmd);
    if ((char)iVar4 == '\0' || timeGranted_mode) break;
    if (state != EXECUTING) goto LAB_0032c0c0;
    aVar6 = cmd_time_check;
LAB_0032c0d5:
    ActionMessage::setAction(cmd,aVar6);
LAB_0032c0da:
    hVar3 = (helics)0x8;
  }
switchD_0032bf3b_caseD_4:
  *this = hVar9;
  this[1] = hVar3;
  this[2] = (helics)state;
  return (tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool>)SUB83(this,0);
}

Assistant:

std::tuple<FederateStates, MessageProcessingResult, bool>
    processCoordinatorMessage(ActionMessage& cmd,
                              TimeCoordinator* timeCoord,
                              const FederateStates state,
                              const bool timeGranted_mode,
                              const GlobalFederateId localID)
{
    FederateStates newState{state};
    bool newMode{timeGranted_mode};
    MessageProcessingResult proc{MessageProcessingResult::CONTINUE_PROCESSING};
    bool returnable{false};
    switch (cmd.action()) {
        case CMD_IGNORE:
        default:
            break;
        case CMD_USER_RETURN: {
            auto tidHash = std::hash<std::thread::id>{}(std::this_thread::get_id());
            auto tid = static_cast<std::int32_t>(tidHash);
            if (tid == cmd.messageID) {
                proc = MessageProcessingResult::USER_RETURN;
            }

        } break;
        case CMD_TIME_BLOCK:
        case CMD_TIME_BARRIER:
        case CMD_TIME_BARRIER_CLEAR:
        case CMD_TIME_UNBLOCK: {
            auto processed = timeCoord->processTimeMessage(cmd);
            if (processed != TimeProcessingResult::NOT_PROCESSED) {
                if (!timeGranted_mode) {
                    if (state == FederateStates::INITIALIZING) {
                        cmd.setAction(CMD_EXEC_CHECK);
                        proc = MessageProcessingResult::REPROCESS_MESSAGE;
                    }
                    if (state == FederateStates::EXECUTING) {
                        cmd.setAction(CMD_TIME_CHECK);
                        proc = MessageProcessingResult::REPROCESS_MESSAGE;
                    }
                }
            }
            break;
        }
        case CMD_INIT_GRANT:
            if (state == FederateStates::CREATED) {
                if (checkActionFlag(cmd, observer_flag) ||
                    checkActionFlag(cmd, dynamic_join_flag)) {
                    timeCoord->setDynamicJoining();
                }
                if (checkActionFlag(cmd, iteration_requested_flag)) {
                    newState = FederateStates::CREATED;
                    newMode = false;
                    proc = MessageProcessingResult::ITERATING;
                } else {
                    newState = FederateStates::INITIALIZING;
                    newMode = true;
                    proc = MessageProcessingResult::NEXT_STEP;
                }
            }
            break;
        case CMD_EXEC_REQUEST:
            if ((cmd.source_id == localID) &&
                checkActionFlag(cmd, indicator_flag)) {  // this sets up a time request
                IterationRequest iterate = IterationRequest::NO_ITERATIONS;
                if (checkActionFlag(cmd, iteration_requested_flag)) {
                    iterate = (checkActionFlag(cmd, required_flag)) ?
                        IterationRequest::FORCE_ITERATION :
                        IterationRequest::ITERATE_IF_NEEDED;
                }
                timeCoord->enteringExecMode(iterate);
                newMode = false;
                break;
            }
            [[fallthrough]];
        case CMD_EXEC_GRANT: {
            bool processed = false;
            switch (timeCoord->processTimeMessage(cmd)) {
                case TimeProcessingResult::DELAY_PROCESSING:
                    proc = MessageProcessingResult::DELAY_MESSAGE;
                    processed = true;
                    break;
                case TimeProcessingResult::NOT_PROCESSED:
                    proc = MessageProcessingResult::CONTINUE_PROCESSING;
                    processed = true;
                    break;
                default:
                    break;
            }
            if (processed) {
                break;
            }
        }
            [[fallthrough]];
        case CMD_EXEC_CHECK:  // just check the time for entry
        {
            if (state != FederateStates::INITIALIZING) {
                break;
            }
            if (!timeGranted_mode) {
                auto grant = timeCoord->checkExecEntry(
                    cmd.action() == CMD_EXEC_REQUEST ? cmd.source_id : GlobalFederateId{});
                switch (grant) {
                    case MessageProcessingResult::ITERATING:
                        newMode = true;
                        // returnable = true;
                        proc = grant;
                        break;
                    case MessageProcessingResult::NEXT_STEP:
                        newState = FederateStates::EXECUTING;
                        newMode = true;
                        // returnable = true;
                        proc = grant;
                        break;
                    case MessageProcessingResult::CONTINUE_PROCESSING:
                        if (cmd.action() == CMD_EXEC_GRANT &&
                            !checkActionFlag(cmd, iteration_requested_flag)) {
                            timeCoord->sendUpdatedExecRequest();
                        }
                        break;
                    default:
                        newMode = true;
                        // returnable = true;
                        proc = grant;
                        break;
                }
            }
        } break;
        case CMD_TERMINATE_IMMEDIATELY:
            newState = FederateStates::FINISHED;
            proc = MessageProcessingResult::HALTED;
            break;
        case CMD_STOP:
            newState = FederateStates::FINISHED;
            timeCoord->disconnect();
            proc = MessageProcessingResult::HALTED;
            break;
        case CMD_DISCONNECT_FED_ACK:
            if ((cmd.dest_id == localID) && (cmd.source_id == parent_broker_id)) {
                if ((state != FederateStates::FINISHED) && (state != FederateStates::TERMINATING)) {
                    timeCoord->disconnect();
                }
                newState = FederateStates::FINISHED;
                proc = MessageProcessingResult::HALTED;
            }
            break;
        case CMD_REQUEST_CURRENT_TIME:
        case CMD_TIMING_INFO:
            timeCoord->processTimeMessage(cmd);
            break;
        case CMD_DISCONNECT_FED:
        case CMD_DISCONNECT:
            if (cmd.source_id == localID) {
                if ((state != FederateStates::FINISHED) && (state != FederateStates::TERMINATING)) {
                    timeCoord->disconnect();
                    cmd.dest_id = parent_broker_id;
                    newState = FederateStates::TERMINATING;
                    proc = MessageProcessingResult::REPROCESS_MESSAGE;
                }
            } else {
                // returnable = false;
                switch (timeCoord->processTimeMessage(cmd)) {
                    case TimeProcessingResult::DELAY_PROCESSING:
                        // returnable = true;
                        proc = MessageProcessingResult::DELAY_MESSAGE;
                        break;
                    case TimeProcessingResult::NOT_PROCESSED:
                        // returnable = true;
                        proc = MessageProcessingResult::CONTINUE_PROCESSING;
                        break;
                    default:
                        break;
                }
                if (state != FederateStates::EXECUTING) {
                    break;
                }
                if (!timeGranted_mode) {
                    proc = timeCoord->checkTimeGrant();
                    if (returnableResult(proc)) {
                        newMode = true;
                    }
                }
            }
            break;
        case CMD_BROADCAST_DISCONNECT:
        case CMD_DISCONNECT_BROKER:
        case CMD_DISCONNECT_CORE:
            returnable = false;
            switch (timeCoord->processTimeMessage(cmd)) {
                case TimeProcessingResult::DELAY_PROCESSING:
                    returnable = true;
                    proc = MessageProcessingResult::DELAY_MESSAGE;
                    break;
                case TimeProcessingResult::NOT_PROCESSED:
                    proc = MessageProcessingResult::CONTINUE_PROCESSING;
                    returnable = true;
                    break;
                default:
                    break;
            }
            if (returnable) {
                break;
            }
            if (state != FederateStates::EXECUTING) {
                break;
            }
            if (!timeGranted_mode) {
                proc = timeCoord->checkTimeGrant();
                if (returnableResult(proc)) {
                    newMode = true;
                }
            }
            break;

        case CMD_TIME_REQUEST:
        case CMD_TIME_GRANT:
            returnable = false;
            switch (timeCoord->processTimeMessage(cmd)) {
                case TimeProcessingResult::DELAY_PROCESSING:
                    proc = MessageProcessingResult::DELAY_MESSAGE;
                    returnable = true;
                    break;
                case TimeProcessingResult::NOT_PROCESSED:
                    proc = MessageProcessingResult::CONTINUE_PROCESSING;
                    returnable = true;
                    break;
                default:
                    break;
            }
            if (returnable) {
                break;
            }
            [[fallthrough]];
        case CMD_TIME_CHECK:
            if (state != FederateStates::EXECUTING) {
                if (state == FederateStates::INITIALIZING) {
                    cmd.setAction(CMD_EXEC_CHECK);
                    proc = MessageProcessingResult::REPROCESS_MESSAGE;
                }

                break;
            }
            if (!timeGranted_mode) {
                proc = timeCoord->checkTimeGrant(
                    cmd.action() == CMD_TIME_REQUEST ? cmd.source_id : GlobalFederateId{});
                if (returnableResult(proc)) {
                    newMode = true;
                }
            }
            break;
        case CMD_FORCE_TIME_GRANT: {
            if (cmd.actionTime < timeCoord->getGrantedTime()) {
                break;
            }
            timeCoord->processTimeMessage(cmd);
            newMode = true;
            proc = MessageProcessingResult::NEXT_STEP;
            break;
        }

        case CMD_ERROR:
        case CMD_LOCAL_ERROR:
        case CMD_GLOBAL_ERROR:
            if (cmd.action() == CMD_GLOBAL_ERROR || cmd.source_id == localID ||
                cmd.source_id == parent_broker_id || cmd.source_id == gRootBrokerID ||
                cmd.dest_id != localID) {
                if ((state != FederateStates::FINISHED) && (state != FederateStates::TERMINATING)) {
                    if (cmd.action() != CMD_GLOBAL_ERROR) {
                        timeCoord->localError();
                    }
                    newState = FederateStates::ERRORED;
                    proc = MessageProcessingResult::ERROR_RESULT;
                }
            } else {
                switch (timeCoord->processTimeMessage(cmd)) {
                    case TimeProcessingResult::DELAY_PROCESSING:
                        returnable = true;
                        proc = MessageProcessingResult::DELAY_MESSAGE;
                        break;
                    case TimeProcessingResult::NOT_PROCESSED:
                        returnable = true;
                        proc = MessageProcessingResult::CONTINUE_PROCESSING;
                        break;
                    default:
                        break;
                }
                if (state != FederateStates::EXECUTING) {
                    break;
                }
                if (returnable) {
                    break;
                }
                if (!timeGranted_mode) {
                    proc = timeCoord->checkTimeGrant();
                    if (returnableResult(proc)) {
                        newMode = true;
                    }
                }
            }
            break;
        case CMD_ADD_DEPENDENCY:
        case CMD_REMOVE_DEPENDENCY:
        case CMD_ADD_DEPENDENT:
        case CMD_REMOVE_DEPENDENT:
        case CMD_ADD_INTERDEPENDENCY:
        case CMD_REMOVE_INTERDEPENDENCY:
            if (cmd.dest_id == localID) {
                timeCoord->processDependencyUpdateMessage(cmd);
            }

            break;
    }
    return {newState, proc, newMode};
}